

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

Image * Image_Function_Helper::Threshold
                  (ThresholdDoubleForm4 threshold,Image *in,uint8_t minThreshold,
                  uint8_t maxThreshold)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined1 in_CL;
  ImageTemplate<unsigned_char> *in_RDX;
  code *in_RSI;
  Image *in_RDI;
  undefined1 in_R8B;
  Image *out;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  ImageTemplate<unsigned_char> *pIVar3;
  uint32_t in_stack_ffffffffffffffb0;
  Image *this;
  undefined2 uVar4;
  
  this = in_RDI;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  pIVar3 = in_RDX;
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDX);
  uVar4 = (undefined2)((ulong)pIVar3 >> 0x30);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDX);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (this,uVar1,in_stack_ffffffffffffffb0,(uint8_t)((ushort)uVar4 >> 8),(uint8_t)uVar4);
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(this);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(this);
  (*in_RSI)(in_RDX,0,0,this,0,0,uVar1,uVar2,in_CL,in_R8B);
  return in_RDI;
}

Assistant:

Image Threshold( FunctionTable::ThresholdDoubleForm4 threshold,
                     const Image & in, uint8_t minThreshold, uint8_t maxThreshold )
    {
        Image_Function::ParameterValidation( in );

        Image out = in.generate( in.width(), in.height() );

        threshold( in, 0, 0, out, 0, 0, out.width(), out.height(), minThreshold, maxThreshold );

        return out;
    }